

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

bool __thiscall QCompletionModel::hasChildren(QCompletionModel *this,QModelIndex *parent)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  arrow_operator_result ppQVar4;
  undefined8 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QCompletionModelPrivate *d;
  QCompletionEngine *in_stack_ffffffffffffffb0;
  QAbstractItemModel *pQVar5;
  bool local_21;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QCompletionModel *)0xa69d0f);
  bVar1 = QModelIndex::isValid((QModelIndex *)in_stack_ffffffffffffffb0);
  if (bVar1) {
    local_21 = false;
  }
  else if ((*(byte *)(in_RDI + 4) & 1) == 0) {
    QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_>::operator->
              ((QScopedPointer<QCompletionEngine,_QScopedPointerDeleter<QCompletionEngine>_> *)
               (in_RDI + 3));
    iVar3 = QCompletionEngine::matchCount(in_stack_ffffffffffffffb0);
    if (iVar3 == 0) {
      local_21 = false;
    }
    else {
      local_21 = true;
    }
  }
  else {
    ppQVar4 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
              ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                            *)in_stack_ffffffffffffffb0);
    pQVar5 = *ppQVar4;
    (**(code **)(*in_RDI + 400))(local_20,in_RDI,in_RSI);
    bVar2 = (**(code **)(*(long *)pQVar5 + 0x88))(pQVar5,local_20);
    local_21 = (bool)(bVar2 & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QCompletionModel::hasChildren(const QModelIndex &parent) const
{
    Q_D(const QCompletionModel);
    if (parent.isValid())
        return false;

    if (showAll)
        return d->model->hasChildren(mapToSource(parent));

    if (!engine->matchCount())
        return false;

    return true;
}